

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.hh
# Opt level: O2

bool __thiscall gss::innards::SVOBitset::any(SVOBitset *this)

{
  BitWord *pBVar1;
  bool bVar2;
  ulong uVar3;
  uint i_1;
  ulong uVar4;
  uint i;
  
  uVar3 = (ulong)this->n_words;
  if (uVar3 < 0x11) {
    uVar4 = 0;
    do {
      bVar2 = uVar3 != uVar4;
      if (uVar3 == uVar4) {
        return bVar2;
      }
      pBVar1 = (this->_data).short_data + uVar4;
      uVar4 = uVar4 + 1;
    } while (*pBVar1 == 0);
  }
  else {
    uVar4 = 0;
    do {
      bVar2 = uVar3 != uVar4;
      if (uVar3 == uVar4) {
        return bVar2;
      }
      pBVar1 = (this->_data).long_data + uVar4;
      uVar4 = uVar4 + 1;
    } while (*pBVar1 == 0);
  }
  return bVar2;
}

Assistant:

constexpr auto _is_long() const -> bool
        {
            return n_words > svo_size;
        }